

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeWidget::setHeaderItem(QTreeWidget *this,QTreeWidgetItem *item)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QTreeModel *pQVar4;
  QTreeWidgetItem *in_RSI;
  QTreeWidget *in_RDI;
  long in_FS_OFFSET;
  int oldCount;
  QTreeWidgetPrivate *d;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QTreeWidget *)0x917c65);
  if (in_RSI != (QTreeWidgetItem *)0x0) {
    in_RSI->view = in_RDI;
    iVar1 = columnCount((QTreeWidget *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                       );
    iVar2 = QTreeWidgetItem::columnCount((QTreeWidgetItem *)0x917ca0);
    if (iVar1 < iVar2) {
      pQVar4 = QTreeWidgetPrivate::treeModel((QTreeWidgetPrivate *)0x917cb4);
      QModelIndex::QModelIndex((QModelIndex *)0x917cc6);
      QTreeWidgetItem::columnCount((QTreeWidgetItem *)0x917cd8);
      QAbstractItemModel::beginInsertColumns((QModelIndex *)pQVar4,(int)local_20,iVar1);
    }
    else {
      iVar2 = QTreeWidgetItem::columnCount((QTreeWidgetItem *)0x917d07);
      if (iVar2 < iVar1) {
        pQVar4 = QTreeWidgetPrivate::treeModel((QTreeWidgetPrivate *)0x917d1b);
        QModelIndex::QModelIndex((QModelIndex *)0x917d2a);
        iVar2 = QTreeWidgetItem::columnCount((QTreeWidgetItem *)0x917d34);
        QAbstractItemModel::beginRemoveColumns((QModelIndex *)pQVar4,(int)local_38,iVar2);
      }
    }
    pQVar4 = QTreeWidgetPrivate::treeModel((QTreeWidgetPrivate *)0x917d58);
    if (pQVar4->headerItem != (QTreeWidgetItem *)0x0) {
      (*pQVar4->headerItem->_vptr_QTreeWidgetItem[1])();
    }
    pQVar4 = QTreeWidgetPrivate::treeModel((QTreeWidgetPrivate *)0x917d86);
    pQVar4->headerItem = in_RSI;
    iVar2 = iVar1;
    iVar3 = QTreeWidgetItem::columnCount((QTreeWidgetItem *)0x917da1);
    if (iVar2 < iVar3) {
      QTreeWidgetPrivate::treeModel((QTreeWidgetPrivate *)0x917db5);
      QAbstractItemModel::endInsertColumns();
    }
    else {
      iVar2 = QTreeWidgetItem::columnCount((QTreeWidgetItem *)0x917dd1);
      if (iVar2 < iVar1) {
        QTreeWidgetPrivate::treeModel((QTreeWidgetPrivate *)0x917de5);
        QAbstractItemModel::endRemoveColumns();
      }
    }
    pQVar4 = QTreeWidgetPrivate::treeModel((QTreeWidgetPrivate *)0x917df9);
    QAbstractItemModel::headerDataChanged((Orientation)pQVar4,1,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeWidget::setHeaderItem(QTreeWidgetItem *item)
{
    Q_D(QTreeWidget);
    if (!item)
        return;
    item->view = this;

    int oldCount = columnCount();
    if (oldCount < item->columnCount())
         d->treeModel()->beginInsertColumns(QModelIndex(), oldCount, item->columnCount() - 1);
    else if (oldCount > item->columnCount())
         d->treeModel()->beginRemoveColumns(QModelIndex(), item->columnCount(), oldCount - 1);
    delete d->treeModel()->headerItem;
    d->treeModel()->headerItem = item;
    if (oldCount < item->columnCount())
        d->treeModel()->endInsertColumns();
    else if (oldCount > item->columnCount())
        d->treeModel()->endRemoveColumns();
    d->treeModel()->headerDataChanged(Qt::Horizontal, 0, oldCount);
}